

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall spdlog::logger::logger(logger *this,string *name,sink_ptr *single_sink)

{
  sinks_init_list sinks;
  element_type *local_98;
  element_type local_60;
  element_type local_50;
  string local_40;
  sink_ptr *local_20;
  sink_ptr *single_sink_local;
  string *name_local;
  logger *this_local;
  
  local_20 = single_sink;
  single_sink_local = (sink_ptr *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)&local_60,single_sink);
  local_50.level_.super___atomic_base<int>._M_i = (__atomic_base<int>)0x1;
  local_50._12_4_ = 0;
  sinks._M_len = 1;
  sinks._M_array = (iterator)&local_60;
  local_50._vptr_sink = (_func_int **)&local_60;
  logger(this,&local_40,sinks);
  local_98 = &local_50;
  do {
    local_98 = local_98 + -1;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)local_98);
  } while (local_98 != &local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

logger(std::string name, sink_ptr single_sink)
        : logger(std::move(name), {std::move(single_sink)})
    {}